

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch.cpp
# Opt level: O0

void __thiscall bidfx_public_api::tools::CountdownLatch::CountDown(CountdownLatch *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> lck;
  CountdownLatch *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->lock);
  if (this->count == 0) {
    std::condition_variable::notify_all();
  }
  else {
    this->count = this->count - 1;
    if (this->count == 0) {
      std::condition_variable::notify_all();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void CountdownLatch::CountDown()
{
    std::unique_lock<std::mutex> lck(lock);
    if (0 == count)
    {
        cv.notify_all();
        return;
    }
    --count;
    if (0 == count)
    {
        cv.notify_all();
    }
}